

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Device.hpp
# Opt level: O0

void __thiscall SoapySDR::Device::writeSetting<char_const*>(Device *this,string *key,char **value)

{
  undefined8 in_RSI;
  long *in_RDI;
  char **in_stack_ffffffffffffff98;
  string local_38 [56];
  
  SettingToString<char_const*>(in_stack_ffffffffffffff98);
  (**(code **)(*in_RDI + 0x330))(in_RDI,in_RSI,local_38);
  std::__cxx11::string::~string(local_38);
  return;
}

Assistant:

void SoapySDR::Device::writeSetting(const std::string &key, const Type &value)
{
    this->writeSetting(key, SoapySDR::SettingToString(value));
}